

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O2

string * tinyusdz::io::GetFileExtension(string *__return_storage_ptr__,string *FileName)

{
  long lVar1;
  allocator local_19;
  
  lVar1 = std::__cxx11::string::find_last_of((char *)FileName,0x211473);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
  }
  else {
    std::__cxx11::string::find_last_of((char *)FileName,0x211473);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)FileName);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileExtension(const std::string &FileName) {
  if (FileName.find_last_of(".") != std::string::npos)
    return FileName.substr(FileName.find_last_of(".") + 1);
  return "";
}